

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O1

string * __thiscall
PDFObjectParser::MaybeDecryptString
          (string *__return_storage_ptr__,PDFObjectParser *this,string *inString)

{
  IPDFParserExtender *pIVar1;
  pointer pcVar2;
  bool bVar3;
  long *local_40 [2];
  long local_30 [2];
  
  if ((this->mDecryptionHelper != (DecryptionHelper *)0x0) &&
     (bVar3 = DecryptionHelper::IsEncrypted(this->mDecryptionHelper), bVar3)) {
    bVar3 = DecryptionHelper::CanDecryptDocument(this->mDecryptionHelper);
    if (bVar3) {
      DecryptionHelper::DecryptString(__return_storage_ptr__,this->mDecryptionHelper,inString);
      return __return_storage_ptr__;
    }
    pIVar1 = this->mParserExtender;
    if (pIVar1 != (IPDFParserExtender *)0x0) {
      pcVar2 = (inString->_M_dataplus)._M_p;
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_40,pcVar2,pcVar2 + inString->_M_string_length);
      (**(code **)(*(long *)pIVar1 + 0x28))(__return_storage_ptr__,pIVar1,(string *)local_40);
      if (local_40[0] == local_30) {
        return __return_storage_ptr__;
      }
      operator_delete(local_40[0],local_30[0] + 1);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (inString->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + inString->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string PDFObjectParser::MaybeDecryptString(const std::string& inString) {
	if (mDecryptionHelper && mDecryptionHelper->IsEncrypted()) {

		if (mDecryptionHelper->CanDecryptDocument())
			return mDecryptionHelper->DecryptString(inString);
		else {
			if (mParserExtender)
				return mParserExtender->DecryptString(inString);
			else
				return inString;
		}
	}
	else {
		return inString;
	}
}